

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

QList<QByteArray> *
QTimeZone::availableTimeZoneIds(QList<QByteArray> *__return_storage_ptr__,int offsetSeconds)

{
  QTimeZonePrivate *pQVar1;
  Type *pTVar2;
  QArrayDataPointer<QByteArray> *this;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> QStack_c8;
  QUtcTimeZonePrivate local_b0;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QUtcTimeZonePrivate::QUtcTimeZonePrivate(&local_b0);
  this = &local_38;
  QUtcTimeZonePrivate::availableTimeZoneIds((QList<QByteArray> *)this,&local_b0,offsetSeconds);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
           operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>
                       *)this);
  pQVar1 = (pTVar2->backend).d.ptr;
  (*pQVar1->_vptr_QTimeZonePrivate[0x17])(&QStack_c8,pQVar1,offsetSeconds);
  set_union(__return_storage_ptr__,(QList<QByteArray> *)&local_38,(QList<QByteArray> *)&QStack_c8);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&QStack_c8);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
  QUtcTimeZonePrivate::~QUtcTimeZonePrivate(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZone::availableTimeZoneIds(int offsetSeconds)
{
    return set_union(QUtcTimeZonePrivate().availableTimeZoneIds(offsetSeconds),
                     global_tz->backend->availableTimeZoneIds(offsetSeconds));
}